

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O2

int av1_setup_sms_tree(AV1_COMP *cpi,ThreadData_conflict *td)

{
  BLOCK_SIZE BVar1;
  SIMPLE_MOTION_DATA_TREE *pSVar2;
  int iVar3;
  SIMPLE_MOTION_DATA_TREE *tree;
  SIMPLE_MOTION_DATA_TREE *pSVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong num;
  size_t sVar11;
  bool bVar12;
  
  if ((cpi->oxcf).kf_cfg.key_freq_max == 0) {
    return 0;
  }
  if ((cpi->oxcf).pass == AOM_RC_FIRST_PASS) {
    bVar12 = false;
  }
  else {
    bVar12 = cpi->compressor_stage != '\x01';
  }
  BVar1 = ((cpi->common).seq_params)->sb_size;
  aom_free(td->sms_tree);
  sVar11 = 1;
  num = (ulong)(BVar1 == BLOCK_128X128) << 10 | 0x155;
  if (!bVar12) {
    num = sVar11;
  }
  pSVar4 = (SIMPLE_MOTION_DATA_TREE *)aom_calloc(num,0x78);
  td->sms_tree = pSVar4;
  if (pSVar4 == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    iVar3 = -1;
  }
  else {
    if (bVar12) {
      uVar6 = 0x100;
      if (BVar1 == BLOCK_128X128) {
        uVar6 = 0x400;
      }
      for (lVar7 = 0; uVar8 = uVar6, uVar6 * 0x78 - lVar7 != 0; lVar7 = lVar7 + 0x78) {
        *(undefined1 *)((long)pSVar4->split + lVar7 + -8) = 0;
      }
      while (3 < (uint)uVar6) {
        uVar5 = (uint)uVar6 >> 2;
        uVar6 = (ulong)uVar5;
        uVar8 = uVar8 & 0xffffffff;
        lVar7 = uVar8 * 0x78 + 8;
        for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
          pSVar2 = td->sms_tree;
          pSVar2[uVar8].block_size = square[sVar11];
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            *(SIMPLE_MOTION_DATA_TREE **)((long)pSVar2->split + lVar10 * 8 + lVar7 + -8) = pSVar4;
            pSVar4 = pSVar4 + 1;
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x78;
        }
        sVar11 = sVar11 + 1;
      }
      pSVar4 = td->sms_tree;
    }
    else {
      pSVar4->block_size = BLOCK_16X16;
    }
    td->sms_root = pSVar4 + (num - 1);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int av1_setup_sms_tree(AV1_COMP *const cpi, ThreadData *td) {
  // The structure 'sms_tree' is used to store the simple motion search data for
  // partition pruning in inter frames. Hence, the memory allocations and
  // initializations related to it are avoided for allintra encoding mode.
  if (cpi->oxcf.kf_cfg.key_freq_max == 0) return 0;

  AV1_COMMON *const cm = &cpi->common;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  int sms_tree_index = 0;
  SIMPLE_MOTION_DATA_TREE *this_sms;
  int square_index = 1;
  int nodes;

  aom_free(td->sms_tree);
  td->sms_tree =
      (SIMPLE_MOTION_DATA_TREE *)aom_calloc(tree_nodes, sizeof(*td->sms_tree));
  if (!td->sms_tree) return -1;
  this_sms = &td->sms_tree[0];

  if (!stat_generation_stage) {
    const int leaf_factor = is_sb_size_128 ? 4 : 1;
    const int leaf_nodes = 256 * leaf_factor;

    // Sets up all the leaf nodes in the tree.
    for (sms_tree_index = 0; sms_tree_index < leaf_nodes; ++sms_tree_index) {
      SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
      tree->block_size = square[0];
    }

    // Each node has 4 leaf nodes, fill each block_size level of the tree
    // from leafs to the root.
    for (nodes = leaf_nodes >> 2; nodes > 0; nodes >>= 2) {
      for (int i = 0; i < nodes; ++i) {
        SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
        tree->block_size = square[square_index];
        for (int j = 0; j < 4; j++) tree->split[j] = this_sms++;
        ++sms_tree_index;
      }
      ++square_index;
    }
  } else {
    // Allocation for firstpass/LAP stage
    // TODO(Mufaddal): refactor square_index to use a common block_size macro
    // from firstpass.c
    SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
    square_index = 2;
    tree->block_size = square[square_index];
  }

  // Set up the root node for the largest superblock size
  td->sms_root = &td->sms_tree[tree_nodes - 1];
  return 0;
}